

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

void __thiscall QPDF::reconstruct_xref(QPDF *this,QPDFExc *e,bool found_startxref)

{
  long *plVar1;
  pointer ptVar2;
  pointer pQVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  _Base_ptr p_Var7;
  long lVar8;
  long lVar9;
  longlong lVar10;
  undefined8 uVar11;
  qpdf_offset_t qVar12;
  _Rb_tree_node_base *p_Var13;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var14;
  QPDFExc *pQVar15;
  undefined7 in_register_00000011;
  pointer ptVar16;
  pointer plVar17;
  QPDFObjGen *iter;
  key_type *__x;
  QPDFObjectHandle t;
  long local_298;
  int obj;
  allocator<char> local_289;
  QPDF *local_288;
  undefined4 local_27c;
  undefined1 local_278 [8];
  _Alloc_hider local_270 [15];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  anon_class_16_2_2ef5c38d check_warnings;
  int gen;
  Token t1;
  Token t2;
  vector<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>
  found_objects;
  vector<long_long,_std::allocator<long_long>_> startxrefs;
  vector<long_long,_std::allocator<long_long>_> trailers;
  string local_80;
  qpdf_offset_t token_start;
  vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> to_delete;
  QPDFObjectHandle local_40;
  
  local_27c = (undefined4)CONCAT71(in_register_00000011,found_startxref);
  _Var14._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if ((_Var14._M_head_impl)->reconstructed_xref == true) {
    pQVar15 = (QPDFExc *)__cxa_allocate_exception(0x80);
    QPDFExc::QPDFExc(pQVar15,e);
    __cxa_throw(pQVar15,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  check_warnings.max_warnings =
       ((long)*(pointer *)((long)&(_Var14._M_head_impl)->warnings + 8) -
        *(long *)&((_Var14._M_head_impl)->warnings).
                  super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_> >> 7) + 1000;
  (_Var14._M_head_impl)->reconstructed_xref = true;
  (_Var14._M_head_impl)->in_xref_reconstruction = true;
  (_Var14._M_head_impl)->fixed_dangling_refs = false;
  check_warnings.this = this;
  std::__cxx11::string::string<std::allocator<char>>((string *)&t1,"",(allocator<char> *)&t);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&t2,"file is damaged",(allocator<char> *)&local_1f8);
  damagedPDF((QPDFExc *)local_278,this,(string *)&t1,-1,(string *)&t2);
  warn(this,(QPDFExc *)local_278);
  QPDFExc::~QPDFExc((QPDFExc *)local_278);
  std::__cxx11::string::~string((string *)&t2);
  std::__cxx11::string::~string((string *)&t1);
  warn(this,e);
  std::__cxx11::string::string<std::allocator<char>>((string *)&t1,"",(allocator<char> *)&t);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&t2,"Attempting to reconstruct cross-reference table",
             (allocator<char> *)&local_1f8);
  damagedPDF((QPDFExc *)local_278,this,(string *)&t1,-1,(string *)&t2);
  warn(this,(QPDFExc *)local_278);
  QPDFExc::~QPDFExc((QPDFExc *)local_278);
  std::__cxx11::string::~string((string *)&t2);
  std::__cxx11::string::~string((string *)&t1);
  to_delete.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  to_delete.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  to_delete.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _Var14._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  for (p_Var7 = *(_Base_ptr *)((long)&(_Var14._M_head_impl)->xref_table + 0x18);
      pQVar3 = to_delete.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
               super__Vector_impl_data._M_finish,
      __x = to_delete.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
            super__Vector_impl_data._M_start,
      p_Var7 != (_Rb_tree_node_base *)((long)&(_Var14._M_head_impl)->xref_table + 8U);
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    iVar5 = QPDFXRefEntry::getType((QPDFXRefEntry *)&p_Var7[1]._M_parent);
    if (iVar5 == 1) {
      std::vector<QPDFObjGen,std::allocator<QPDFObjGen>>::emplace_back<QPDFObjGen_const&>
                ((vector<QPDFObjGen,std::allocator<QPDFObjGen>> *)&to_delete,
                 (QPDFObjGen *)(p_Var7 + 1));
    }
  }
  for (; __x != pQVar3; __x = __x + 1) {
    std::
    _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
    ::erase(&(((this->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->xref_table)._M_t,__x);
  }
  found_objects.
  super__Vector_base<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  found_objects.
  super__Vector_base<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  found_objects.
  super__Vector_base<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  trailers.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  trailers.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  trailers.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  startxrefs.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  startxrefs.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  startxrefs.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  plVar1 = *(long **)&(((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
  (**(code **)(*plVar1 + 0x28))(plVar1,0,2);
  lVar8 = (**(code **)(**(long **)&(((this->m)._M_t.
                                     super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                     .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                   file).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                      + 0x20))();
  plVar1 = *(long **)&(((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
  (**(code **)(*plVar1 + 0x28))(plVar1,0,0);
  while (lVar9 = (**(code **)(**(long **)&(((this->m)._M_t.
                                            super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                            .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                           _M_head_impl)->file).
                                          super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                             + 0x20))(), lVar9 < lVar8) {
    readToken(&t1,this,(((this->m)._M_t.
                         super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                         .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                       super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,10);
    lVar9 = (**(code **)(**(long **)&(((this->m)._M_t.
                                       super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                       .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)
                                     ->file).
                                     super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                        0x20))();
    local_278 = (undefined1  [8])t1.value._M_string_length;
    lVar10 = QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::convert
                       ((unsigned_long *)local_278);
    token_start = lVar9 - lVar10;
    _Var14._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    if (t1.type == tt_integer) {
      uVar11 = (**(code **)(**(long **)&((_Var14._M_head_impl)->file).
                                        super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                           + 0x20))();
      readToken(&t2,this,(((this->m)._M_t.
                           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                           .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                         super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,10);
      if (t2.type == tt_integer) {
        readToken((Token *)local_278,this,
                  (((this->m)._M_t.
                    super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                    super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                  super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&t,"obj",(allocator<char> *)&local_1f8);
        bVar4 = QPDFTokenizer::Token::isWord((Token *)local_278,(string *)&t);
        std::__cxx11::string::~string((string *)&t);
        QPDFTokenizer::Token::~Token((Token *)local_278);
        if (bVar4) {
          obj = QUtil::string_to_int(t1.value._M_dataplus._M_p);
          gen = QUtil::string_to_int(t2.value._M_dataplus._M_p);
          if (((this->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->xref_table_max_id < obj)
          {
            std::__cxx11::string::string<std::allocator<char>>((string *)&t,"",&local_289);
            std::__cxx11::to_string(&local_80,obj);
            std::operator+(&local_1f8,"ignoring object with impossibly large id ",&local_80);
            damagedPDF((QPDFExc *)local_278,this,(string *)&t,-1,&local_1f8);
            warn(this,(QPDFExc *)local_278);
            QPDFExc::~QPDFExc((QPDFExc *)local_278);
            std::__cxx11::string::~string((string *)&local_1f8);
            std::__cxx11::string::~string((string *)&local_80);
            std::__cxx11::string::~string((string *)&t);
          }
          else {
            std::vector<std::tuple<int,int,long_long>,std::allocator<std::tuple<int,int,long_long>>>
            ::emplace_back<int&,int&,long_long&>
                      ((vector<std::tuple<int,int,long_long>,std::allocator<std::tuple<int,int,long_long>>>
                        *)&found_objects,&obj,&gen,&token_start);
          }
        }
      }
      plVar1 = *(long **)&(((this->m)._M_t.
                            super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                            .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                          super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
      (**(code **)(*plVar1 + 0x28))(plVar1,uVar11,0);
      QPDFTokenizer::Token::~Token(&t2);
    }
    else {
      if (*(long *)&((_Var14._M_head_impl)->trailer).super_BaseHandle == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_278,"trailer",(allocator<char> *)&t2);
        bVar4 = QPDFTokenizer::Token::isWord(&t1,(string *)local_278);
        std::__cxx11::string::~string((string *)local_278);
        if (bVar4) {
          local_278 = (undefined1  [8])
                      (**(code **)(**(long **)&(((this->m)._M_t.
                                                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                                 .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                                _M_head_impl)->file).
                                               super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                                  + 0x20))();
          std::vector<long_long,_std::allocator<long_long>_>::emplace_back<long_long>
                    (&trailers,(longlong *)local_278);
          goto LAB_001dfc65;
        }
      }
      if ((char)local_27c == '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_278,"startxref",(allocator<char> *)&t2);
        bVar4 = QPDFTokenizer::Token::isWord(&t1,(string *)local_278);
        std::__cxx11::string::~string((string *)local_278);
        if (bVar4) {
          local_278 = (undefined1  [8])
                      (**(code **)(**(long **)&(((this->m)._M_t.
                                                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                                 .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                                _M_head_impl)->file).
                                               super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                                  + 0x20))();
          std::vector<long_long,_std::allocator<long_long>_>::emplace_back<long_long>
                    (&startxrefs,(longlong *)local_278);
        }
      }
    }
LAB_001dfc65:
    reconstruct_xref::anon_class_16_2_2ef5c38d::operator()(&check_warnings);
    (**(code **)(**(long **)&(((this->m)._M_t.
                               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                               .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                             super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> + 0x10))();
    QPDFTokenizer::Token::~Token(&t1);
  }
  if (((((char)local_27c == '\0') &&
       (startxrefs.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        startxrefs.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_finish)) &&
      (found_objects.
       super__Vector_base<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       found_objects.
       super__Vector_base<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) &&
     (found_objects.
      super__Vector_base<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].super__Tuple_impl<0UL,_int,_int,_long_long>.
      super__Tuple_impl<1UL,_int,_long_long>.super__Tuple_impl<2UL,_long_long>.
      super__Head_base<2UL,_long_long,_false>._M_head_impl <
      startxrefs.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_finish[-1])) {
    plVar1 = *(long **)&(((this->m)._M_t.
                          super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                          .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                        super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
    (**(code **)(*plVar1 + 0x28))
              (plVar1,startxrefs.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1],0);
    readToken((Token *)local_278,this,
              (((this->m)._M_t.
                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
              super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
    lVar10 = QUtil::string_to_ll(local_270[0]._M_p);
    QPDFTokenizer::Token::~Token((Token *)local_278);
    if (lVar10 != 0) {
      read_xref(this,lVar10);
      getRoot((QPDF *)&t2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_278,"/Pages",(allocator<char> *)&t);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&t1,(string *)&t2);
      bVar4 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&t1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&t1.value);
      std::__cxx11::string::~string((string *)local_278);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&t2.value);
      if (bVar4) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&t1,"",(allocator<char> *)&t);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&t2,"startxref was more than 1024 bytes before end of file",
                   (allocator<char> *)&local_1f8);
        damagedPDF((QPDFExc *)local_278,this,(string *)&t1,-1,(string *)&t2);
        warn(this,(QPDFExc *)local_278);
        QPDFExc::~QPDFExc((QPDFExc *)local_278);
        std::__cxx11::string::~string((string *)&t2);
        std::__cxx11::string::~string((string *)&t1);
        initializeEncryption(this);
        _Var14._M_head_impl =
             (this->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
        (_Var14._M_head_impl)->parsed = true;
        (_Var14._M_head_impl)->reconstructed_xref = false;
        goto LAB_001e0608;
      }
    }
  }
  ptVar2 = found_objects.
           super__Vector_base<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (ptVar16 = found_objects.
                 super__Vector_base<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish; ptVar16 != ptVar2;
      ptVar16 = ptVar16 + -1) {
    insertXrefEntry(this,*(int *)&ptVar16[-1].super__Tuple_impl<0UL,_int,_int,_long_long>.
                                  super__Tuple_impl<1UL,_int,_long_long>.field_0xc,1,
                    ptVar16[-1].super__Tuple_impl<0UL,_int,_int,_long_long>.
                    super__Tuple_impl<1UL,_int,_long_long>.super__Tuple_impl<2UL,_long_long>.
                    super__Head_base<2UL,_long_long,_false>._M_head_impl,
                    ptVar16[-1].super__Tuple_impl<0UL,_int,_int,_long_long>.
                    super__Tuple_impl<1UL,_int,_long_long>.super__Head_base<1UL,_int,_false>.
                    _M_head_impl);
    reconstruct_xref::anon_class_16_2_2ef5c38d::operator()(&check_warnings);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(((this->m)._M_t.
                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->deleted_objects)._M_t);
  plVar17 = trailers.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_finish;
  while (plVar17 !=
         trailers.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
         super__Vector_impl_data._M_start) {
    plVar1 = *(long **)&(((this->m)._M_t.
                          super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                          .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                        super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
    (**(code **)(*plVar1 + 0x28))(plVar1,plVar17[-1],0);
    readTrailer((QPDF *)&t);
    bVar4 = QPDFObjectHandle::isDictionary(&t);
    plVar17 = plVar17 + -1;
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_278,"/Root",(allocator<char> *)&t1);
      bVar4 = QPDFObjectHandle::hasKey(&t,(string *)local_278);
      std::__cxx11::string::~string((string *)local_278);
      if (bVar4) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                   &((this->m)._M_t.
                     super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                     super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                     super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->trailer,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&t);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&t.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        break;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&t1,"trailer",(allocator<char> *)&local_1f8);
      qVar12 = *plVar17;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&t2,"recovered trailer has no /Root entry",(allocator<char> *)&local_80);
      damagedPDF((QPDFExc *)local_278,this,(string *)&t1,qVar12,(string *)&t2);
      warn(this,(QPDFExc *)local_278);
      QPDFExc::~QPDFExc((QPDFExc *)local_278);
      std::__cxx11::string::~string((string *)&t2);
      std::__cxx11::string::~string((string *)&t1);
    }
    reconstruct_xref::anon_class_16_2_2ef5c38d::operator()(&check_warnings);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&t.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  _Var14._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if (*(long *)&((_Var14._M_head_impl)->trailer).super_BaseHandle == 0) {
    p_Var13 = *(_Base_ptr *)((long)&(_Var14._M_head_impl)->xref_table + 0x18);
    local_298 = 0;
    for (; p_Var13 != (_Rb_tree_node_base *)((long)&(_Var14._M_head_impl)->xref_table + 8U);
        p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
      t2.value._M_string_length = (size_type)p_Var13[1]._M_right;
      t2._0_8_ = p_Var13[1]._M_parent;
      t2.value._M_dataplus._M_p = (pointer)p_Var13[1]._M_left;
      iVar5 = QPDFXRefEntry::getType((QPDFXRefEntry *)&t2);
      if (iVar5 == 1) {
        getObject((QPDF *)&t,(QPDFObjGen)this);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_278,"/XRef",(allocator<char> *)&local_1f8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&t1,"",(allocator<char> *)&local_80);
        bVar4 = QPDFObjectHandle::isStreamOfType(&t,(string *)local_278,(string *)&t1);
        std::__cxx11::string::~string((string *)&t1);
        std::__cxx11::string::~string((string *)local_278);
        if (bVar4) {
          qVar12 = QPDFXRefEntry::getOffset((QPDFXRefEntry *)&t2);
          QPDFObjectHandle::getDict((QPDFObjectHandle *)&local_1f8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_278,"/Size",(allocator<char> *)&local_80);
          QPDFObjectHandle::getKey((QPDFObjectHandle *)&t1,&local_1f8);
          uVar6 = QPDFObjectHandle::getUIntValueAsUInt((QPDFObjectHandle *)&t1);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&t1.value);
          std::__cxx11::string::~string((string *)local_278);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length);
          if (local_298 < qVar12 || uVar6 != 0) {
            QPDFObjectHandle::getDict(&local_40);
            setTrailer(this,&local_40);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_40.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            local_298 = qVar12;
          }
          reconstruct_xref::anon_class_16_2_2ef5c38d::operator()(&check_warnings);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&t.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
    }
    if (0 < local_298) {
      read_xref(this,local_298);
    }
  }
  _Var14._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if (*(long *)&((_Var14._M_head_impl)->trailer).super_BaseHandle == 0) {
LAB_001e033a:
    t.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    t.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_288 = this;
    for (p_Var7 = *(_Base_ptr *)((long)&((_Var14._M_head_impl)->obj_cache)._M_t + 0x18);
        this = local_288,
        (_Rb_tree_header *)p_Var7 !=
        (_Rb_tree_header *)((long)&((_Var14._M_head_impl)->obj_cache)._M_t + 8U);
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&t2,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&p_Var7[1]._M_parent);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_278,"/Catalog",(allocator<char> *)&local_1f8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&t1,"",(allocator<char> *)&local_80);
      bVar4 = QPDFObjectHandle::isDictionaryOfType
                        ((QPDFObjectHandle *)&t2,(string *)local_278,(string *)&t1);
      std::__cxx11::string::~string((string *)&t1);
      std::__cxx11::string::~string((string *)local_278);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&t2.value);
      if (bVar4) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_278,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&p_Var7[1]._M_parent);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&t,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_278);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_270);
      }
    }
    if (t.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      _Var14._M_head_impl =
           (local_288->m)._M_t.
           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      if (*(long *)&((_Var14._M_head_impl)->trailer).super_BaseHandle == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&t1,"",(allocator<char> *)&local_1f8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&t2,"unable to find trailer dictionary while recovering damaged file",
                   (allocator<char> *)&local_80);
        damagedPDF((QPDFExc *)local_278,this,(string *)&t1,-1,(string *)&t2);
        warn(this,(QPDFExc *)local_278);
        QPDFExc::~QPDFExc((QPDFExc *)local_278);
        std::__cxx11::string::~string((string *)&t2);
        std::__cxx11::string::~string((string *)&t1);
        QPDFObjectHandle::newDictionary();
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                   &((this->m)._M_t.
                     super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                     super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                     super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->trailer,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_278);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_270);
        _Var14._M_head_impl =
             (this->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_278,"/Root",(allocator<char> *)&t1);
      QPDFObjectHandle::replaceKey(&(_Var14._M_head_impl)->trailer,(string *)local_278,&t);
      std::__cxx11::string::~string((string *)local_278);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&t.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    _Var14._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  }
  else if ((_Var14._M_head_impl)->parsed == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_278,"/Root",(allocator<char> *)&t2);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&t1,(string *)&(_Var14._M_head_impl)->trailer);
    bVar4 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&t1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&t1.value);
    std::__cxx11::string::~string((string *)local_278);
    _Var14._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    if (!bVar4) goto LAB_001e033a;
  }
  if (*(long *)&((_Var14._M_head_impl)->trailer).super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> == 0) {
    pQVar15 = (QPDFExc *)__cxa_allocate_exception(0x80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_278,"",(allocator<char> *)&t2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&t1,"unable to find trailer dictionary while recovering damaged file",
               (allocator<char> *)&t);
    damagedPDF(pQVar15,this,(string *)local_278,-1,(string *)&t1);
    __cxa_throw(pQVar15,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  if (*(size_t *)((long)&((_Var14._M_head_impl)->xref_table)._M_t + 0x28) == 0) {
    pQVar15 = (QPDFExc *)__cxa_allocate_exception(0x80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_278,"",(allocator<char> *)&t2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&t1,"unable to find objects while recovering damaged file",
               (allocator<char> *)&t);
    damagedPDF(pQVar15,this,(string *)local_278,-1,(string *)&t1);
    __cxa_throw(pQVar15,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  reconstruct_xref::anon_class_16_2_2ef5c38d::operator()(&check_warnings);
  _Var14._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if ((_Var14._M_head_impl)->parsed == false) {
    (_Var14._M_head_impl)->parsed = true;
    getAllPages(this);
    reconstruct_xref::anon_class_16_2_2ef5c38d::operator()(&check_warnings);
    _Var14._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    if (*(pointer *)
         &((_Var14._M_head_impl)->all_pages).
          super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl ==
        *(pointer *)((long)&(_Var14._M_head_impl)->all_pages + 8)) {
      (_Var14._M_head_impl)->parsed = false;
      pQVar15 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_278,"",(allocator<char> *)&t2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&t1,"unable to find any pages while recovering damaged file",
                 (allocator<char> *)&t);
      damagedPDF(pQVar15,this,(string *)local_278,-1,(string *)&t1);
      __cxa_throw(pQVar15,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
  }
  (_Var14._M_head_impl)->in_xref_reconstruction = false;
LAB_001e0608:
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            (&startxrefs.super__Vector_base<long_long,_std::allocator<long_long>_>);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            (&trailers.super__Vector_base<long_long,_std::allocator<long_long>_>);
  std::
  _Vector_base<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>::
  ~_Vector_base(&found_objects.
                 super__Vector_base<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>
               );
  std::_Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>::~_Vector_base
            (&to_delete.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>);
  return;
}

Assistant:

void
QPDF::reconstruct_xref(QPDFExc& e, bool found_startxref)
{
    if (m->reconstructed_xref) {
        // Avoid xref reconstruction infinite loops. This is getting very hard to reproduce because
        // qpdf is throwing many fewer exceptions while parsing. Most situations are warnings now.
        throw e;
    }

    // If recovery generates more than 1000 warnings, the file is so severely damaged that there
    // probably is no point trying to continue.
    const auto max_warnings = m->warnings.size() + 1000U;
    auto check_warnings = [this, max_warnings]() {
        if (m->warnings.size() > max_warnings) {
            throw damagedPDF("", -1, "too many errors while reconstructing cross-reference table");
        }
    };

    m->reconstructed_xref = true;
    m->in_xref_reconstruction = true;
    // We may find more objects, which may contain dangling references.
    m->fixed_dangling_refs = false;

    warn(damagedPDF("", -1, "file is damaged"));
    warn(e);
    warn(damagedPDF("", -1, "Attempting to reconstruct cross-reference table"));

    // Delete all references to type 1 (uncompressed) objects
    std::vector<QPDFObjGen> to_delete;
    for (auto const& iter: m->xref_table) {
        if (iter.second.getType() == 1) {
            to_delete.emplace_back(iter.first);
        }
    }
    for (auto const& iter: to_delete) {
        m->xref_table.erase(iter);
    }

    std::vector<std::tuple<int, int, qpdf_offset_t>> found_objects;
    std::vector<qpdf_offset_t> trailers;
    std::vector<qpdf_offset_t> startxrefs;

    m->file->seek(0, SEEK_END);
    qpdf_offset_t eof = m->file->tell();
    m->file->seek(0, SEEK_SET);
    // Don't allow very long tokens here during recovery. All the interesting tokens are covered.
    static size_t const MAX_LEN = 10;
    while (m->file->tell() < eof) {
        QPDFTokenizer::Token t1 = readToken(*m->file, MAX_LEN);
        qpdf_offset_t token_start = m->file->tell() - toO(t1.getValue().length());
        if (t1.isInteger()) {
            auto pos = m->file->tell();
            auto t2 = readToken(*m->file, MAX_LEN);
            if (t2.isInteger() && readToken(*m->file, MAX_LEN).isWord("obj")) {
                int obj = QUtil::string_to_int(t1.getValue().c_str());
                int gen = QUtil::string_to_int(t2.getValue().c_str());
                if (obj <= m->xref_table_max_id) {
                    found_objects.emplace_back(obj, gen, token_start);
                } else {
                    warn(damagedPDF(
                        "", -1, "ignoring object with impossibly large id " + std::to_string(obj)));
                }
            }
            m->file->seek(pos, SEEK_SET);
        } else if (!m->trailer && t1.isWord("trailer")) {
            trailers.emplace_back(m->file->tell());
        } else if (!found_startxref && t1.isWord("startxref")) {
            startxrefs.emplace_back(m->file->tell());
        }
        check_warnings();
        m->file->findAndSkipNextEOL();
    }

    if (!found_startxref && !startxrefs.empty() && !found_objects.empty() &&
        startxrefs.back() > std::get<2>(found_objects.back())) {
        try {
            m->file->seek(startxrefs.back(), SEEK_SET);
            if (auto offset = QUtil::string_to_ll(readToken(*m->file).getValue().data())) {
                read_xref(offset);
                if (getRoot().getKey("/Pages").isDictionary()) {
                    QTC::TC("qpdf", "QPDF startxref more than 1024 before end");
                    warn(damagedPDF(
                        "", -1, "startxref was more than 1024 bytes before end of file"));
                    initializeEncryption();
                    m->parsed = true;
                    m->reconstructed_xref = false;
                    return;
                }
            }
        } catch (...) {
            // ok, bad luck. Do recovery.
        }
    }

    auto rend = found_objects.rend();
    for (auto it = found_objects.rbegin(); it != rend; it++) {
        auto [obj, gen, token_start] = *it;
        insertXrefEntry(obj, 1, token_start, gen);
        check_warnings();
    }
    m->deleted_objects.clear();

    for (auto it = trailers.rbegin(); it != trailers.rend(); it++) {
        m->file->seek(*it, SEEK_SET);
        auto t = readTrailer();
        if (!t.isDictionary()) {
            // Oh well.  It was worth a try.
        } else {
            if (t.hasKey("/Root")) {
                m->trailer = t;
                break;
            }
            warn(damagedPDF("trailer", *it, "recovered trailer has no /Root entry"));
        }
        check_warnings();
    }

    if (!m->trailer) {
        qpdf_offset_t max_offset{0};
        size_t max_size{0};
        // If there are any xref streams, take the last one to appear.
        for (auto const& iter: m->xref_table) {
            auto entry = iter.second;
            if (entry.getType() != 1) {
                continue;
            }
            auto oh = getObject(iter.first);
            try {
                if (!oh.isStreamOfType("/XRef")) {
                    continue;
                }
            } catch (std::exception&) {
                continue;
            }
            auto offset = entry.getOffset();
            auto size = oh.getDict().getKey("/Size").getUIntValueAsUInt();
            if (size > max_size || (size == max_size && offset > max_offset)) {
                max_offset = offset;
                setTrailer(oh.getDict());
            }
            check_warnings();
        }
        if (max_offset > 0) {
            try {
                read_xref(max_offset);
            } catch (std::exception&) {
                warn(damagedPDF(
                    "", -1, "error decoding candidate xref stream while recovering damaged file"));
            }
            QTC::TC("qpdf", "QPDF recover xref stream");
        }
    }

    if (!m->trailer || (!m->parsed && !m->trailer.getKey("/Root").isDictionary())) {
        // Try to find a Root dictionary. As a quick fix try the one with the highest object id.
        QPDFObjectHandle root;
        for (auto const& iter: m->obj_cache) {
            try {
                if (QPDFObjectHandle(iter.second.object).isDictionaryOfType("/Catalog")) {
                    root = iter.second.object;
                }
            } catch (std::exception&) {
                continue;
            }
        }
        if (root) {
            if (!m->trailer) {
                warn(damagedPDF(
                    "", -1, "unable to find trailer dictionary while recovering damaged file"));
                m->trailer = QPDFObjectHandle::newDictionary();
            }
            m->trailer.replaceKey("/Root", root);
        }
    }

    if (!m->trailer) {
        // We could check the last encountered object to see if it was an xref stream.  If so, we
        // could try to get the trailer from there.  This may make it possible to recover files with
        // bad startxref pointers even when they have object streams.

        throw damagedPDF("", -1, "unable to find trailer dictionary while recovering damaged file");
    }
    if (m->xref_table.empty()) {
        // We cannot check for an empty xref table in parse because empty tables are valid when
        // creating QPDF objects from JSON.
        throw damagedPDF("", -1, "unable to find objects while recovering damaged file");
    }
    check_warnings();
    if (!m->parsed) {
        m->parsed = true;
        getAllPages();
        check_warnings();
        if (m->all_pages.empty()) {
            m->parsed = false;
            throw damagedPDF("", -1, "unable to find any pages while recovering damaged file");
        }
    }

    m->in_xref_reconstruction = false;
    // We could iterate through the objects looking for streams and try to find objects inside of
    // them, but it's probably not worth the trouble.  Acrobat can't recover files with any errors
    // in an xref stream, and this would be a real long shot anyway.  If we wanted to do anything
    // that involved looking at stream contents, we'd also have to call initializeEncryption() here.
    // It's safe to call it more than once.
}